

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh8_factory.cpp
# Opt level: O2

Accel * __thiscall embree::BVH8Factory::BVH8InstanceArrayMB(BVH8Factory *this,Scene *scene)

{
  BVH8 *bvh;
  Builder *builder;
  AccelInstance *this_00;
  Intersectors intersectors;
  Intersectors IStack_138;
  
  bvh = (BVH8 *)BVHN<8>::operator_new(0x240);
  BVHN<8>::BVHN((BVHN<8> *)bvh,(PrimitiveType *)&InstanceArrayPrimitive::type,scene);
  BVH8InstanceArrayMBIntersectors(&IStack_138,this,bvh);
  builder = (*this->BVH8InstanceArrayMBSceneBuilderSAH)(bvh,scene,MTY_INSTANCE_ARRAY);
  this_00 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_00,(AccelData *)bvh,builder,&IStack_138);
  return &this_00->super_Accel;
}

Assistant:

Accel* BVH8Factory::BVH8InstanceArrayMB(Scene* scene)
  {
    BVH8* accel = new BVH8(InstanceArrayPrimitive::type,scene);
    Accel::Intersectors intersectors = BVH8InstanceArrayMBIntersectors(accel);
    auto gtype = Geometry::MTY_INSTANCE_ARRAY;
    Builder* builder = BVH8InstanceArrayMBSceneBuilderSAH(accel,scene,gtype);
    return new AccelInstance(accel,builder,intersectors);
  }